

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall SQFuncState::SetStackSize(SQFuncState *this,SQInteger n)

{
  SQLocalVarInfo *lvi_00;
  undefined1 local_48 [8];
  SQLocalVarInfo lvi;
  SQInteger size;
  SQInteger n_local;
  SQFuncState *this_local;
  
  lvi._pos = sqvector<SQLocalVarInfo>::size(&this->_vlocals);
  while (n < (long)lvi._pos) {
    lvi._pos = lvi._pos - 1;
    lvi_00 = sqvector<SQLocalVarInfo>::back(&this->_vlocals);
    SQLocalVarInfo::SQLocalVarInfo((SQLocalVarInfo *)local_48,lvi_00);
    if (local_48._0_4_ != OT_NULL) {
      if (lvi._start_op == 0xffffffffffffffff) {
        this->_outers = this->_outers + -1;
      }
      lvi._start_op = GetCurrentPos(this);
      sqvector<SQLocalVarInfo>::push_back(&this->_localvarinfos,(SQLocalVarInfo *)local_48);
    }
    sqvector<SQLocalVarInfo>::pop_back(&this->_vlocals);
    SQLocalVarInfo::~SQLocalVarInfo((SQLocalVarInfo *)local_48);
  }
  return;
}

Assistant:

void SQFuncState::SetStackSize(SQInteger n)
{
    SQInteger size=_vlocals.size();
    while(size>n){
        size--;
        SQLocalVarInfo lvi = _vlocals.back();
        if(sq_type(lvi._name)!=OT_NULL){
            if(lvi._end_op == UINT_MINUS_ONE) { //this means is an outer
                _outers--;
            }
            lvi._end_op = GetCurrentPos();
            _localvarinfos.push_back(lvi);
        }
        _vlocals.pop_back();
    }
}